

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<log_multi,_example> *
LEARNER::init_multiclass_learner<log_multi,example,LEARNER::learner<char,example>>
          (free_ptr<log_multi> *dat,learner<char,_example> *base,
          _func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *predict,parser *p,
          size_t ws,prediction_type_t pred_type)

{
  learner<log_multi,_example> *plVar1;
  long lVar2;
  undefined **ppuVar3;
  label_parser *plVar4;
  byte bVar5;
  
  bVar5 = 0;
  plVar1 = learner<log_multi,example>::init_learner<LEARNER::learner<char,example>>
                     ((dat->_M_t).super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_log_multi_*,_false>._M_head_impl,base,learn,predict,ws,
                      pred_type);
  (dat->_M_t).super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.super__Head_base<0UL,_log_multi_*,_false>.
  _M_head_impl = (log_multi *)0x0;
  *(undefined8 *)(plVar1 + 0x58) = *(undefined8 *)(plVar1 + 0x18);
  *(code **)(plVar1 + 0x68) = MULTICLASS::finish_example<log_multi>;
  ppuVar3 = &MULTICLASS::mc_label;
  plVar4 = &p->lp;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar4->default_label = (_func_void_void_ptr *)*ppuVar3;
    ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
    plVar4 = (label_parser *)((long)plVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return plVar1;
}

Assistant:

learner<T, E>& init_multiclass_learner(free_ptr<T>& dat, L* base, void (*learn)(T&, L&, E&),
    void (*predict)(T&, L&, E&), parser* p, size_t ws,
    prediction_type::prediction_type_t pred_type = prediction_type::multiclass)
{
  learner<T, E>& l = learner<T, E>::init_learner(dat.get(), base, learn, predict, ws, pred_type);

  dat.release();
  l.set_finish_example(MULTICLASS::finish_example<T>);
  p->lp = MULTICLASS::mc_label;
  return l;
}